

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O3

Compressor * Imf_3_2::newCompressor(Compression c,size_t maxScanLineSize,Header *hdr)

{
  DwaCompressor *this;
  
  switch(c) {
  case RLE_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x28);
    RleCompressor::RleCompressor((RleCompressor *)this,hdr,maxScanLineSize);
    break;
  case ZIPS_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x38);
    ZipCompressor::ZipCompressor((ZipCompressor *)this,hdr,maxScanLineSize,1);
    break;
  case ZIP_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x38);
    ZipCompressor::ZipCompressor((ZipCompressor *)this,hdr,maxScanLineSize,0x10);
    break;
  case PIZ_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x58);
    PizCompressor::PizCompressor((PizCompressor *)this,hdr,maxScanLineSize,0x20);
    break;
  case PXR24_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x40);
    Pxr24Compressor::Pxr24Compressor((Pxr24Compressor *)this,hdr,maxScanLineSize,0x10);
    break;
  case B44_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x58);
    B44Compressor::B44Compressor((B44Compressor *)this,hdr,maxScanLineSize,0x20,false);
    break;
  case B44A_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x58);
    B44Compressor::B44Compressor((B44Compressor *)this,hdr,maxScanLineSize,0x20,true);
    break;
  case DWAA_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x128);
    DwaCompressor::DwaCompressor(this,hdr,(int)maxScanLineSize,0x20,STATIC_HUFFMAN);
    break;
  case DWAB_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x128);
    DwaCompressor::DwaCompressor(this,hdr,(int)maxScanLineSize,0x100,STATIC_HUFFMAN);
    break;
  default:
    this = (DwaCompressor *)0x0;
  }
  return &this->super_Compressor;
}

Assistant:

Compressor*
newCompressor (Compression c, size_t maxScanLineSize, const Header& hdr)
{
    switch (c)
    {
        case RLE_COMPRESSION: return new RleCompressor (hdr, maxScanLineSize);

        case ZIPS_COMPRESSION:

            return new ZipCompressor (hdr, maxScanLineSize, 1);

        case ZIP_COMPRESSION:

            return new ZipCompressor (hdr, maxScanLineSize, 16);

        case PIZ_COMPRESSION:

            return new PizCompressor (hdr, maxScanLineSize, 32);

        case PXR24_COMPRESSION:

            return new Pxr24Compressor (hdr, maxScanLineSize, 16);

        case B44_COMPRESSION:

            return new B44Compressor (hdr, maxScanLineSize, 32, false);

        case B44A_COMPRESSION:

            return new B44Compressor (hdr, maxScanLineSize, 32, true);

        case DWAA_COMPRESSION:

            return new DwaCompressor (
                hdr,
                static_cast<int> (maxScanLineSize),
                32,
                DwaCompressor::STATIC_HUFFMAN);

        case DWAB_COMPRESSION:

            return new DwaCompressor (
                hdr,
                static_cast<int> (maxScanLineSize),
                256,
                DwaCompressor::STATIC_HUFFMAN);

        default: return 0;
    }
}